

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

size_t move_NAs_to_front(size_t *ix_arr,size_t st,size_t end,int *x)

{
  size_t sVar1;
  size_t row;
  size_t temp;
  size_t st_non_na;
  int *x_local;
  size_t end_local;
  size_t st_local;
  size_t *ix_arr_local;
  
  st_non_na = st;
  for (row = st; row <= end; row = row + 1) {
    if (x[ix_arr[row]] < 0) {
      sVar1 = ix_arr[st_non_na];
      ix_arr[st_non_na] = ix_arr[row];
      ix_arr[row] = sVar1;
      st_non_na = st_non_na + 1;
    }
  }
  return st_non_na;
}

Assistant:

size_t move_NAs_to_front(size_t ix_arr[], size_t st, size_t end, int x[])
{
    size_t st_non_na = st;
    size_t temp;

    for (size_t row = st; row <= end; row++)
    {
        if (unlikely(x[ix_arr[row]] < 0))
        {
            temp = ix_arr[st_non_na];
            ix_arr[st_non_na] = ix_arr[row];
            ix_arr[row] = temp;
            st_non_na++;
        }
    }

    return st_non_na;
}